

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::CollationSettings::copyReorderingFrom
          (CollationSettings *this,CollationSettings *other,UErrorCode *errorCode)

{
  uint8_t *table;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  table = other->reorderTable;
  if (table != (uint8_t *)0x0) {
    this->minHighNoReorder = other->minHighNoReorder;
    if (other->reorderCodesCapacity != 0) {
      setReorderArrays(this,other->reorderCodes,other->reorderCodesLength,other->reorderRanges,
                       other->reorderRangesLength,table,errorCode);
      return;
    }
    this->reorderTable = table;
    this->reorderRanges = other->reorderRanges;
    this->reorderRangesLength = other->reorderRangesLength;
    this->reorderCodes = other->reorderCodes;
    this->reorderCodesLength = other->reorderCodesLength;
    return;
  }
  this->reorderTable = (uint8_t *)0x0;
  this->minHighNoReorder = 0;
  this->reorderRangesLength = 0;
  this->reorderCodesLength = 0;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }